

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

Llb_Grp_t * Llb_ManGroupCreateFirst(Llb_Man_t *pMan)

{
  Aig_Man_t *pAVar1;
  Llb_Grp_t *pLVar2;
  void *Entry;
  int iVar3;
  
  pLVar2 = Llb_ManGroupAlloc(pMan);
  for (iVar3 = 0; pAVar1 = pMan->pAig, iVar3 < pAVar1->nRegs; iVar3 = iVar3 + 1) {
    Entry = Vec_PtrEntry(pAVar1->vCis,pAVar1->nTruePis + iVar3);
    Vec_PtrPush(pLVar2->vOuts,Entry);
  }
  return pLVar2;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFirst( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );
    Saig_ManForEachLo( pMan->pAig, pObj, i )
        Vec_PtrPush( p->vOuts, pObj );
    return p;
}